

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  value *this;
  undefined8 uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  service srv;
  string captured;
  copy_filter flt;
  service local_260 [8];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  undefined1 local_228 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_220;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [16];
  function *local_1f8;
  undefined8 uStack_1f0;
  code *local_1e8;
  code *pcStack_1e0;
  
  local_210 = 0;
  local_208[0] = 0;
  local_218 = local_208;
  cppcms::service::service(local_260,argc,argv);
  this = (value *)cppcms::service::settings();
  local_1f8 = (function *)((ulong)local_1f8 & 0xffffffffffffff00);
  write_tests = cppcms::json::value::get<bool>(this,"test.write",(bool *)&local_1f8);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<async_test>();
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/async","");
  cppcms::mount_point::mount_point((mount_point *)&local_1f8,(string *)local_258);
  cppcms::applications_pool::mount(uVar1,local_228,&local_1f8,1);
  cppcms::mount_point::~mount_point((mount_point *)&local_1f8);
  if (local_258[0] != local_248) {
    operator_delete(local_258[0]);
  }
  if (local_220 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_220);
  }
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<sync_test>();
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"/sync","");
  cppcms::mount_point::mount_point((mount_point *)&local_1f8,(string *)local_258);
  cppcms::applications_pool::mount(uVar1,local_238,&local_1f8,0);
  cppcms::mount_point::~mount_point((mount_point *)&local_1f8);
  if (local_258[0] != local_248) {
    operator_delete(local_258[0]);
  }
  if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
  }
  uStack_1f0 = 0;
  pcStack_1e0 = std::_Function_handler<void_(),_submitter>::_M_invoke;
  local_1e8 = std::_Function_handler<void_(),_submitter>::_M_manager;
  local_1f8 = (function *)local_260;
  cppcms::service::after_fork((function *)local_260);
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,3);
  }
  cppcms::copy_filter::copy_filter((copy_filter *)&local_1f8,(ostream *)&std::cerr);
  cppcms::service::run();
  cppcms::copy_filter::detach_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_218,(string *)local_258);
  if (local_258[0] != local_248) {
    operator_delete(local_258[0]);
  }
  cppcms::copy_filter::~copy_filter((copy_filter *)&local_1f8);
  cppcms::service::~service(local_260);
  lVar2 = std::__cxx11::string::find((char *)&local_218,0x10a0ba,0);
  if (lVar2 != -1) {
    do {
      count_timeouts = count_timeouts + 1;
      lVar2 = std::__cxx11::string::find((char *)&local_218,0x10a0ba,lVar2 + 10);
    } while (lVar2 != -1);
  }
  if (write_tests == true) {
    if (((async_bad_count != 2) ||
        (((sync_bad_count != 2 || (count_timeouts != 4)) || (above_3to != 2)))) || (below_2to != 2))
    goto LAB_00107adf;
LAB_00107a80:
    print_count_report((ostream *)&std::cout);
    if (run_ok != false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      iVar3 = 0;
      std::ostream::flush();
      goto LAB_00107b44;
    }
    lVar2 = 0x14;
    pcVar4 = "Python script failed";
  }
  else {
    if ((eof_detected == true) && (count_timeouts == 5)) goto LAB_00107a80;
LAB_00107adf:
    print_count_report((ostream *)&std::cerr);
    lVar2 = 6;
    pcVar4 = "Failed";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  iVar3 = 1;
  std::ostream::flush();
LAB_00107b44:
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  return iVar3;
}

Assistant:

int main(int argc,char **argv)
{
	std::string captured;
	try {
		cppcms::service srv(argc,argv);
		write_tests = srv.settings().get("test.write",false);
		srv.applications_pool().mount( 	cppcms::create_pool<async_test>(),
						cppcms::mount_point("/async"),
						cppcms::app::asynchronous);
		srv.applications_pool().mount( cppcms::create_pool<sync_test>(), cppcms::mount_point("/sync"));
		srv.after_fork(submitter(srv));
		cppcms::copy_filter flt(std::cerr); // record the log
		srv.run();
		captured = flt.detach(); // get the log
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	size_t pos = 0;
	while((pos=captured.find("Timeout on connection",pos))!=std::string::npos) {
		pos+=10;
		count_timeouts++;
	}
	if(
		write_tests ?
		(
			async_bad_count != 2 
			|| sync_bad_count != 2 
			|| count_timeouts != 4
			|| above_3to != 2
			|| below_2to != 2
		)
		:
		(
			!eof_detected 
			|| count_timeouts != 5
		)
	  ) 
	{
		print_count_report(std::cerr);
		std::cerr << "Failed" << std::endl;
		return EXIT_FAILURE;
	}
	print_count_report(std::cout);
	if(!run_ok ) {
		std::cerr << "Python script failed" << std::endl;
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
}